

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_epoll_wait(int epoll_fd,int maxevents,int timeout)

{
  size_t __nbytes;
  long lVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *puVar7;
  char *pcVar8;
  long lVar9;
  size_t sStack_250;
  undefined1 local_248 [8];
  char buf [512];
  undefined1 local_40 [8];
  uint64_t val;
  
  lVar1 = -((ulong)(uint)maxevents * 0xc + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)((long)&sStack_250 + lVar1) = 0x106168;
  uVar2 = epoll_wait(epoll_fd,(epoll_event *)(local_248 + lVar1),maxevents,timeout);
  if (uVar2 == 0xffffffff) {
    *(undefined8 *)((long)&sStack_250 + lVar1) = 0x106220;
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    *(undefined8 *)((long)&sStack_250 + lVar1) = 0x106238;
    __xpg_strerror_r(iVar6,local_248,0x200);
    puVar7 = (undefined8 *)((long)&sStack_250 + lVar1);
    pcVar8 = "to handle epoll wait";
    uVar5 = 0xbb;
LAB_00106209:
    puVar7[-1] = local_248;
    puVar7[-2] = 0x106212;
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            uVar5,"vfio_epoll_wait",pcVar8);
    *puVar7 = 0x10621b;
    exit(iVar6);
  }
  val._4_4_ = uVar2;
  if (0 < (int)uVar2) {
    *(undefined8 *)((long)&sStack_250 + lVar1) = 8;
    __nbytes = *(size_t *)((long)&sStack_250 + lVar1);
    for (lVar9 = 0; (ulong)uVar2 * 0xc - lVar9 != 0; lVar9 = lVar9 + 0xc) {
      iVar6 = *(int *)(local_248 + lVar9 + lVar1 + 4);
      *(undefined8 *)((long)&sStack_250 + lVar1) = 0x10619f;
      sVar3 = read(iVar6,local_40,__nbytes);
      if (sVar3 == -1) {
        *(undefined8 *)((long)&sStack_250 + lVar1) = 0x1061c2;
        piVar4 = __errno_location();
        iVar6 = *piVar4;
        *(undefined8 *)((long)&sStack_250 + lVar1) = 0x1061da;
        __xpg_strerror_r(iVar6,local_248,0x200);
        puVar7 = (undefined8 *)((long)&sStack_250 + lVar1);
        pcVar8 = "to read event";
        uVar5 = 0xc1;
        goto LAB_00106209;
      }
    }
  }
  return val._4_4_;
}

Assistant:

int vfio_epoll_wait(int epoll_fd, int maxevents, int timeout) {
	struct epoll_event events[maxevents];
	int rc;

	while (1) {
		// Waiting for packets
		rc = (int) check_err(epoll_wait(epoll_fd, events, maxevents, timeout), "to handle epoll wait");
		if (rc > 0) {
			/* epoll_wait has at least one fd ready to read */
			for (int i = 0; i < rc; i++) {
				uint64_t val;
				// read event file descriptor to clear interrupt.
				check_err(read(events[i].data.fd, &val, sizeof(val)), "to read event");
			}
			break;
		} else {
			/* rc == 0, epoll_wait timed out */
			break;
		}
	}

	return rc;
}